

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::createInstanceWithNullApplicationInfoTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *poVar1;
  VkInstance log;
  PlatformInterface *vk;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  qpTestResult qVar5;
  ResultCollector resultCollector;
  VkInstanceCreateInfo instanceCreateInfo;
  ResultCollector local_248;
  VkInstanceCreateInfo local_1f8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_140 [272];
  
  log = (VkInstance)context->m_testCtx->m_log;
  local_1b8._0_8_ = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"");
  tcu::ResultCollector::ResultCollector(&local_248,(TestLog *)log,(string *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8[0]._M_allocated_capacity + 1));
  }
  vk = context->m_platformInterface;
  local_1f8.pNext = (void *)0x0;
  local_1f8.enabledExtensionCount = 0;
  local_1f8._52_4_ = 0;
  local_1f8.ppEnabledExtensionNames = (char **)0x0;
  local_1f8.enabledLayerCount = 0;
  local_1f8._36_4_ = 0;
  local_1f8.ppEnabledLayerNames = (char **)0x0;
  local_1f8.flags = 0;
  local_1f8._20_4_ = 0;
  local_1f8.pApplicationInfo = (VkApplicationInfo *)0x0;
  local_1f8.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  local_1f8._4_4_ = 0;
  poVar1 = (ostringstream *)(local_1b8 + 8);
  local_1b8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Creating instance with NULL pApplicationInfo",0x2c);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_140);
  ::vk::createInstance
            ((Move<vk::VkInstance_s_*> *)local_1b8,vk,&local_1f8,(VkAllocationCallbacks *)0x0);
  uVar4 = local_1a8[0]._M_allocated_capacity;
  uVar3 = local_1b8._8_8_;
  uVar2 = local_1b8._0_8_;
  poVar1 = (ostringstream *)(local_1b8 + 8);
  local_1b8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Succeeded",9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_140);
  if ((VkInstance)uVar2 != (VkInstance)0x0) {
    (*(code *)uVar3)((VkInstance)uVar2,(VkAllocationCallbacks *)uVar4);
  }
  qVar5 = tcu::ResultCollector::getResult(&local_248);
  local_1b8._0_8_ = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b8,local_248.m_message._M_dataplus._M_p,
             local_248.m_message._M_dataplus._M_p + local_248.m_message._M_string_length);
  __return_storage_ptr__->m_code = qVar5;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1b8._0_8_,
             (DestroyInstanceFunc)(local_1b8._8_8_ + local_1b8._0_8_));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.m_message._M_dataplus._M_p != &local_248.m_message.field_2) {
    operator_delete(local_248.m_message._M_dataplus._M_p,
                    local_248.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.m_prefix._M_dataplus._M_p != &local_248.m_prefix.field_2) {
    operator_delete(local_248.m_prefix._M_dataplus._M_p,
                    local_248.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createInstanceWithNullApplicationInfoTest (Context& context)
{
	tcu::TestLog&				log						= context.getTestContext().getLog();
	tcu::ResultCollector		resultCollector			(log);
	const PlatformInterface&	platformInterface		= context.getPlatformInterface();

	const VkInstanceCreateInfo		instanceCreateInfo		=
	{
		VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO,	// VkStructureType				sType;
		DE_NULL,								// const void*					pNext;
		(VkInstanceCreateFlags)0u,				// VkInstanceCreateFlags		flags;
		DE_NULL,								// const VkApplicationInfo*		pAppInfo;
		0u,										// deUint32						layerCount;
		DE_NULL,								// const char*const*			ppEnabledLayernames;
		0u,										// deUint32						extensionCount;
		DE_NULL,								// const char*const*			ppEnabledExtensionNames;
	};

	log << TestLog::Message << "Creating instance with NULL pApplicationInfo" << TestLog::EndMessage;

	try
	{
		const Unique<VkInstance> instance(createInstance(platformInterface, &instanceCreateInfo));
		log << TestLog::Message << "Succeeded" << TestLog::EndMessage;
	}
	catch (const vk::Error& err)
	{
		resultCollector.fail("Failed, Error code: " + de::toString(err.getMessage()));
	}

	return tcu::TestStatus(resultCollector.getResult(), resultCollector.getMessage());
}